

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhash.c
# Opt level: O1

tommy_uint32_t tommy_strhash_u32(tommy_uint64_t init_val,void *void_key)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long in_FS_OFFSET;
  
  uVar5 = (int)init_val + 0xdeadbeef;
  uVar2 = uVar5;
  uVar3 = uVar5;
  do {
    uVar4 = *void_key;
    if ((~(0x1010100 - uVar4 | uVar4) & 0x80808080) == 0) {
      uVar3 = uVar3 + uVar4;
      uVar4 = *(uint *)((long)void_key + 4);
      if ((~(0x1010100 - uVar4 | uVar4) & 0x80808080) != 0) {
        if ((uVar4 & 0xff) != 0) {
          uVar2 = uVar2 + (uVar4 & 0xff);
          if ((uVar4 & 0xff00) != 0) {
            uVar2 = uVar2 + (uVar4 & 0xffff00);
          }
        }
        goto LAB_0010f91f;
      }
      uVar2 = uVar2 + uVar4;
      uVar4 = *(uint *)((long)void_key + 8);
      if ((~(0x1010100 - uVar4 | uVar4) & 0x80808080) != 0) {
        if ((uVar4 & 0xff) != 0) {
          uVar5 = uVar5 + (uVar4 & 0xff);
          if ((uVar4 & 0xff00) != 0) {
            uVar5 = uVar5 + (uVar4 & 0xffff00);
          }
        }
        goto LAB_0010f91f;
      }
      uVar4 = uVar4 + uVar5;
      uVar3 = (uVar4 * 0x10 | uVar4 >> 0x1c) ^ uVar3 - uVar4;
      uVar5 = (uVar3 << 6 | uVar3 >> 0x1a) ^ uVar2 - uVar3;
      iVar6 = uVar3 + uVar4 + uVar2;
      uVar2 = (uVar5 << 8 | uVar5 >> 0x18) ^ (uVar4 + uVar2) - uVar5;
      iVar7 = uVar5 + iVar6;
      uVar3 = (uVar2 << 0x10 | uVar2 >> 0x10) ^ iVar6 - uVar2;
      iVar6 = uVar2 + iVar7;
      uVar2 = (uVar3 << 0x13 | uVar3 >> 0xd) ^ iVar7 - uVar3;
      uVar3 = uVar3 + iVar6;
      uVar5 = (uVar2 << 4 | uVar2 >> 0x1c) ^ iVar6 - uVar2;
      uVar2 = uVar2 + uVar3;
      void_key = (void *)((long)void_key + 0xc);
      bVar1 = true;
    }
    else {
      if ((uVar4 & 0xff) != 0) {
        uVar3 = uVar3 + (uVar4 & 0xff);
        if ((uVar4 & 0xff00) != 0) {
          uVar3 = uVar3 + (uVar4 & 0xffff00);
        }
      }
LAB_0010f91f:
      bVar1 = false;
    }
    if (!bVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
        uVar5 = (uVar5 ^ uVar2) - (uVar2 << 0xe | uVar2 >> 0x12);
        uVar3 = (uVar3 ^ uVar5) - (uVar5 * 0x800 | uVar5 >> 0x15);
        uVar2 = (uVar2 ^ uVar3) - (uVar3 * 0x2000000 | uVar3 >> 7);
        uVar5 = (uVar5 ^ uVar2) - (uVar2 * 0x10000 | uVar2 >> 0x10);
        uVar3 = (uVar3 ^ uVar5) - (uVar5 * 0x10 | uVar5 >> 0x1c);
        uVar2 = (uVar2 ^ uVar3) - (uVar3 * 0x4000 | uVar3 >> 0x12);
        return (uVar5 ^ uVar2) - (uVar2 * 0x1000000 | uVar2 >> 8);
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

tommy_uint32_t tommy_strhash_u32(tommy_uint64_t init_val, const void* void_key)
{
	const unsigned char* key = tommy_cast(const unsigned char*, void_key);
	tommy_uint32_t a, b, c;
	tommy_uint32_t m[3] = { 0xff, 0xff00, 0xff0000 };

	a = b = c = 0xdeadbeef + init_val;
	/* this is different than original lookup3 and the result won't match */

	while (1) {
		tommy_uint32_t v = tommy_le_uint32_read(key);

		if (tommy_haszero_u32(v)) {
			if (v & m[0]) {
				a += v & m[0];
				if (v & m[1]) {
					a += v & m[1];
					if (v & m[2])
						a += v & m[2];
				}
			}

			break;
		}

		a += v;

		v = tommy_le_uint32_read(key + 4);

		if (tommy_haszero_u32(v)) {
			if (v & m[0]) {
				b += v & m[0];
				if (v & m[1]) {
					b += v & m[1];
					if (v & m[2])
						b += v & m[2];
				}
			}

			break;
		}

		b += v;

		v = tommy_le_uint32_read(key + 8);

		if (tommy_haszero_u32(v)) {
			if (v & m[0]) {
				c += v & m[0];
				if (v & m[1]) {
					c += v & m[1];
					if (v & m[2])
						c += v & m[2];
				}
			}

			break;
		}

		c += v;

		tommy_mix(a, b, c);

		key += 12;
	}

	/* for lengths that are multiplers of 12 we already have called mix */
	/* this is different than the original lookup3 and the result won't match */

	tommy_final(a, b, c);

	return c;
}